

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btConvexHullComputer.cpp
# Opt level: O2

Edge * __thiscall
btConvexHullInternal::Pool<btConvexHullInternal::Edge>::newObject
          (Pool<btConvexHullInternal::Edge> *this)

{
  int iVar1;
  PoolArray<btConvexHullInternal::Edge> *this_00;
  undefined4 extraout_var;
  EVP_PKEY_CTX *in_RSI;
  Edge *pEVar2;
  
  pEVar2 = this->freeObjects;
  if (pEVar2 == (Edge *)0x0) {
    this_00 = this->nextArray;
    if (this_00 == (PoolArray<btConvexHullInternal::Edge> *)0x0) {
      this_00 = (PoolArray<btConvexHullInternal::Edge> *)btAlignedAllocInternal(0x18,0x10);
      in_RSI = (EVP_PKEY_CTX *)(ulong)(uint)this->arraySize;
      PoolArray<btConvexHullInternal::Edge>::PoolArray(this_00,this->arraySize);
      this_00->next = this->arrays;
      this->arrays = this_00;
    }
    else {
      this->nextArray = this_00->next;
    }
    iVar1 = PoolArray<btConvexHullInternal::Edge>::init(this_00,in_RSI);
    pEVar2 = (Edge *)CONCAT44(extraout_var,iVar1);
  }
  this->freeObjects = pEVar2->next;
  pEVar2->face = (Face *)0x0;
  *(undefined8 *)&pEVar2->copy = 0;
  pEVar2->reverse = (Edge *)0x0;
  pEVar2->target = (Vertex *)0x0;
  pEVar2->next = (Edge *)0x0;
  pEVar2->prev = (Edge *)0x0;
  return pEVar2;
}

Assistant:

T* newObject()
				{
					T* o = freeObjects;
					if (!o)
					{
						PoolArray<T>* p = nextArray;
						if (p)
						{
							nextArray = p->next;
						}
						else
						{
							p = new(btAlignedAlloc(sizeof(PoolArray<T>), 16)) PoolArray<T>(arraySize);
							p->next = arrays;
							arrays = p;
						}
						o = p->init();
					}
					freeObjects = o->next;
					return new(o) T();
				}